

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcContextDependentUnit::IfcContextDependentUnit
          (IfcContextDependentUnit *this)

{
  IfcContextDependentUnit *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x68,"IfcContextDependentUnit");
  IfcNamedUnit::IfcNamedUnit(&this->super_IfcNamedUnit,&PTR_construction_vtable_24__00f8bd48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcContextDependentUnit,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcContextDependentUnit,_1UL> *)
             &(this->super_IfcNamedUnit).field_0x38,&PTR_construction_vtable_24__00f8bd68);
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0xf8bce0;
  *(undefined8 *)&this->field_0x68 = 0xf8bd30;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0xf8bd08;
  std::__cxx11::string::string((string *)&(this->super_IfcNamedUnit).field_0x48);
  return;
}

Assistant:

IfcContextDependentUnit() : Object("IfcContextDependentUnit") {}